

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.c
# Opt level: O3

void process_arg(ArgumentState *arg_state,int i,char ***argv)

{
  byte bVar1;
  byte *pbVar2;
  ArgumentDescription *pAVar3;
  int iVar4;
  uint *puVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  uint uVar9;
  char *pcVar10;
  ArgumentState *pAVar11;
  char *pcVar12;
  char **ppcVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  double dVar19;
  FILE *__stream;
  ArgumentDescription *pAVar20;
  
  pAVar20 = arg_state->desc + i;
  pbVar2 = (byte *)arg_state->desc[i].type;
  if (pbVar2 == (byte *)0x0) {
LAB_00126a44:
    pcVar16 = (char *)0x0;
  }
  else {
    bVar1 = *pbVar2;
    if (bVar1 < 0x54) {
      if (bVar1 == 0x2b) {
        *(int *)pAVar20->location = *pAVar20->location + 1;
        goto LAB_00126a44;
      }
      if (bVar1 == 0x46) {
LAB_00126a20:
        bVar18 = bVar1 == 0x46;
        puVar5 = (uint *)pAVar20->location;
        goto LAB_00126a42;
      }
    }
    else {
      if (bVar1 == 0x54) {
        puVar5 = (uint *)pAVar20->location;
        bVar18 = *puVar5 == 0;
LAB_00126a42:
        *puVar5 = (uint)bVar18;
        goto LAB_00126a44;
      }
      if (bVar1 == 0x66) goto LAB_00126a20;
    }
    pcVar16 = **argv;
    pcVar12 = pcVar16 + 1;
    **argv = pcVar12;
    ppcVar13 = *argv;
    if (pcVar16[1] == '\0') {
      ppcVar13 = ppcVar13 + 1;
      *argv = ppcVar13;
    }
    pcVar16 = *ppcVar13;
    if (pcVar16 == (char *)0x0) {
      usage(arg_state,pcVar12);
LAB_00126adf:
      pAVar11 = arg_state;
      process_arg_cold_1();
      pAVar3 = pAVar11->desc;
      fprintf(_stderr,"Usage: %s [flags|args]\n",pAVar11->program_name);
      pcVar12 = pAVar3->name;
      if (pcVar12 != (char *)0x0) {
        pcVar10 = &pAVar3->key;
        do {
          if (*(char **)(pcVar10 + 8) == (char *)0x0) goto LAB_00126b30;
          uVar14 = (uint)*pcVar10;
          uVar15 = 0x2d;
          if (uVar14 == 0x20) {
            uVar15 = 0x20;
          }
          uVar9 = 0x2c;
          if (uVar14 == 0x20) {
            uVar9 = 0x20;
          }
          __stream = _stderr;
          sVar6 = strlen(pcVar12);
          pcVar17 = "                                                                               "
                    + sVar6 + 0x3d;
          if (0x50 < sVar6 + 0x3d) {
            pcVar17 = "";
          }
          lVar7 = 8;
          if (*(char **)(pcVar10 + 0x10) != (char *)0x0) {
            pvVar8 = memchr("ISDfF+TL",(int)**(char **)(pcVar10 + 0x10),9);
            lVar7 = (long)pvVar8 + -0x12e7cd;
          }
          fprintf(__stream,"  %c%c%c --%s%s%s",(ulong)uVar15,(ulong)uVar14,(ulong)uVar9,pcVar12,
                  pcVar17,arg_types_desc_rel + *(int *)(arg_types_desc_rel + lVar7 * 4),__stream,
                  arg_state,ppcVar13,pAVar20,pcVar16,argv);
          if (*(byte **)(pcVar10 + 0x10) == (byte *)0x0) {
LAB_00126bf9:
            pcVar12 = "          ";
LAB_00126c0d:
            fwrite(pcVar12,10,1,_stderr);
            goto switchD_00126c35_caseD_45;
          }
          bVar1 = **(byte **)(pcVar10 + 0x10);
          if (0x52 < bVar1) {
            if (bVar1 == 0x53) {
              pcVar12 = *(char **)(pcVar10 + 0x18);
              if (*pcVar12 == '\0') {
                pcVar12 = " (null)   ";
                goto LAB_00126c0d;
              }
              sVar6 = strlen(pcVar12);
              if (sVar6 < 10) {
                pcVar17 = " %-9s";
              }
              else {
                pcVar12[7] = '\0';
                pcVar12 = *(char **)(pcVar10 + 0x18);
                pcVar17 = " %-7s..";
              }
              goto LAB_00126cc1;
            }
            if ((bVar1 == 0x54) || (bVar1 == 0x66)) goto switchD_00126c35_caseD_46;
            goto switchD_00126c35_caseD_45;
          }
          switch(bVar1) {
          case 0x44:
            fprintf(_stderr," %-9.3e",**(undefined8 **)(pcVar10 + 0x18));
            break;
          case 0x45:
          case 0x47:
          case 0x48:
          case 0x4a:
          case 0x4b:
            break;
          case 0x46:
switchD_00126c35_caseD_46:
            pcVar12 = "true ";
            if (**(int **)(pcVar10 + 0x18) == 0) {
              pcVar12 = "false";
            }
            pcVar17 = " %-9s";
            goto LAB_00126cc1;
          case 0x49:
switchD_00126c35_caseD_49:
            fprintf(_stderr," %-9d",(ulong)**(uint **)(pcVar10 + 0x18));
            break;
          case 0x4c:
            pcVar12 = (char *)**(undefined8 **)(pcVar10 + 0x18);
            pcVar17 = " %-9ld";
LAB_00126cc1:
            fprintf(_stderr,pcVar17,pcVar12);
            break;
          default:
            if (bVar1 == 0) goto LAB_00126bf9;
            if (bVar1 == 0x2b) goto switchD_00126c35_caseD_49;
          }
switchD_00126c35_caseD_45:
          fprintf(_stderr," %s\n",*(char **)(pcVar10 + 8));
LAB_00126b30:
          pcVar12 = *(char **)(pcVar10 + 0x30);
          pcVar10 = pcVar10 + 0x38;
        } while (pcVar12 != (char *)0x0);
      }
      exit(1);
    }
    pcVar12 = pcVar16;
    if (bVar1 < 0x4c) {
      if (bVar1 == 0x44) {
        dVar19 = atof(pcVar16);
        *(double *)pAVar20->location = dVar19;
      }
      else {
        if (bVar1 != 0x49) goto LAB_00126adf;
        iVar4 = atoi(pcVar16);
        *(int *)pAVar20->location = iVar4;
      }
    }
    else if (bVar1 == 0x4c) {
      lVar7 = atol(pcVar16);
      *(long *)pAVar20->location = lVar7;
    }
    else {
      if (bVar1 != 0x53) goto LAB_00126adf;
      pcVar12 = (char *)pAVar20->location;
      iVar4 = atoi(pAVar20->type + 1);
      strncpy(pcVar12,pcVar16,(long)iVar4);
      ppcVar13 = *argv;
      pcVar12 = *ppcVar13;
    }
    sVar6 = strlen(pcVar12);
    *ppcVar13 = pcVar12 + (sVar6 - 1);
  }
  if (pAVar20->pfn == (ArgumentFunction *)0x0) {
    return;
  }
  (*pAVar20->pfn)(arg_state,pcVar16);
  return;
}

Assistant:

void process_arg(ArgumentState *arg_state, int i, char ***argv) {
  char *arg = NULL;
  ArgumentDescription *desc = arg_state->desc;
  if (desc[i].type) {
    char type = desc[i].type[0];
    if (type == 'F' || type == 'f')
      *(int *)desc[i].location = type == 'F' ? 1 : 0;
    else if (type == 'T')
      *(int *)desc[i].location = !*(int *)desc[i].location;
    else if (type == '+')
      (*(int *)desc[i].location)++;
    else {
      arg = *++(**argv) ? **argv : *++(*argv);
      if (!arg) usage(arg_state, NULL);
      switch (type) {
        case 'I':
          *(int *)desc[i].location = atoi(arg);
          break;
        case 'D':
          *(double *)desc[i].location = atof(arg);
          break;
        case 'L':
          *(int64 *)desc[i].location = atoll(arg);
          break;
        case 'S':
          strncpy((char *)desc[i].location, arg, atoi(desc[i].type + 1));
          break;
        default:
          fprintf(stderr, "%s:bad argument description\n", arg_state->program_name);
          exit(1);
          break;
      }
      **argv += strlen(**argv) - 1;
    }
  }
  if (desc[i].pfn) desc[i].pfn(arg_state, arg);
}